

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

uint to_hex(char ch)

{
  char ch_00;
  int iVar1;
  uint uVar2;
  ulong extraout_RAX;
  char *__s;
  undefined7 in_register_00000039;
  uint *puVar4;
  char acStack_50 [56];
  ulong uStack_18;
  ulong uVar3;
  
  if ((byte)(ch - 0x30U) < 10) {
    iVar1 = -0x30;
  }
  else if ((byte)(ch + 0x9fU) < 6) {
    iVar1 = -0x57;
  }
  else {
    if (5 < (byte)(ch + 0xbfU)) {
      puVar4 = (uint *)0x1;
      errx(1,"character \"%c\" is not hex\n");
      __s = acStack_50;
      acStack_50[0x30] = '\0';
      acStack_50[0x31] = '\0';
      acStack_50[0x32] = '\0';
      acStack_50[0x33] = '\0';
      acStack_50[0x34] = '\0';
      acStack_50[0x35] = '\0';
      acStack_50[0x36] = '\0';
      acStack_50[0x37] = '\0';
      uStack_18 = 0;
      acStack_50[0x20] = '\0';
      acStack_50[0x21] = '\0';
      acStack_50[0x22] = '\0';
      acStack_50[0x23] = '\0';
      acStack_50[0x24] = '\0';
      acStack_50[0x25] = '\0';
      acStack_50[0x26] = '\0';
      acStack_50[0x27] = '\0';
      acStack_50[0x28] = '\0';
      acStack_50[0x29] = '\0';
      acStack_50[0x2a] = '\0';
      acStack_50[0x2b] = '\0';
      acStack_50[0x2c] = '\0';
      acStack_50[0x2d] = '\0';
      acStack_50[0x2e] = '\0';
      acStack_50[0x2f] = '\0';
      acStack_50[0x10] = '\0';
      acStack_50[0x11] = '\0';
      acStack_50[0x12] = '\0';
      acStack_50[0x13] = '\0';
      acStack_50[0x14] = '\0';
      acStack_50[0x15] = '\0';
      acStack_50[0x16] = '\0';
      acStack_50[0x17] = '\0';
      acStack_50[0x18] = '\0';
      acStack_50[0x19] = '\0';
      acStack_50[0x1a] = '\0';
      acStack_50[0x1b] = '\0';
      acStack_50[0x1c] = '\0';
      acStack_50[0x1d] = '\0';
      acStack_50[0x1e] = '\0';
      acStack_50[0x1f] = '\0';
      acStack_50[0] = '\0';
      acStack_50[1] = '\0';
      acStack_50[2] = '\0';
      acStack_50[3] = '\0';
      acStack_50[4] = '\0';
      acStack_50[5] = '\0';
      acStack_50[6] = '\0';
      acStack_50[7] = '\0';
      acStack_50[8] = '\0';
      acStack_50[9] = '\0';
      acStack_50[10] = '\0';
      acStack_50[0xb] = '\0';
      acStack_50[0xc] = '\0';
      acStack_50[0xd] = '\0';
      acStack_50[0xe] = '\0';
      acStack_50[0xf] = '\0';
      uVar2 = snprintf(__s,0x40,".byte %x%x\n.byte %x%x\n",(ulong)*puVar4,(ulong)puVar4[1],
                       (ulong)puVar4[2],puVar4[3]);
      uVar3 = (ulong)uVar2;
      uStack_18 = uStack_18 & 0xffffffffffffff;
      while( true ) {
        ch_00 = *__s;
        if (ch_00 == '\0') break;
        __s = __s + 1;
        do_emit_asm(ch_00);
        uVar3 = extraout_RAX;
      }
      return (uint)CONCAT71((int7)(uVar3 >> 8),ch_00);
    }
    iVar1 = -0x37;
  }
  return iVar1 + (int)CONCAT71(in_register_00000039,ch);
}

Assistant:

static unsigned to_hex(char ch) {
    if (ch >= '0' && ch <= '9')
        return ch - '0';
    if (ch >= 'a' && ch <= 'f')
        return ch - 'a' + 10;
    if (ch >= 'A' && ch <= 'F')
        return ch - 'A' + 10;

    errx(1, "character \"%c\" is not hex\n", ch);
}